

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive_manifest.cpp
# Opt level: O0

bool __thiscall
ON_ComponentIdHash32Table::RemoveManifestItem
          (ON_ComponentIdHash32Table *this,ON_ComponentManifestItem_PRIVATE *manifest_item)

{
  bool bVar1;
  ON__UINT32 hash32_00;
  ON_ComponentManifestHash32TableItem *local_40;
  ON_Hash32TableItem *hash_table_item;
  undefined1 auStack_30 [4];
  ON__UINT32 hash32;
  ON_UUID id;
  ON_ComponentManifestItem_PRIVATE *manifest_item_local;
  ON_ComponentIdHash32Table *this_local;
  
  id.Data4 = (uchar  [8])manifest_item;
  _auStack_30 = IdFromManifestItem(&manifest_item->super_ON_ComponentManifestItem);
  bVar1 = ::operator==(&ON_nil_uuid,(ON_UUID_struct *)auStack_30);
  if (!bVar1) {
    hash32_00 = IdHash32((ON_UUID *)auStack_30);
    for (local_40 = (ON_ComponentManifestHash32TableItem *)
                    ON_Hash32Table::FirstItemWithHash(&this->super_ON_Hash32Table,hash32_00);
        local_40 != (ON_ComponentManifestHash32TableItem *)0x0;
        local_40 = (ON_ComponentManifestHash32TableItem *)
                   ON_Hash32Table::NextItemWithHash
                             (&this->super_ON_Hash32Table,&local_40->super_ON_Hash32TableItem)) {
      if ((id.Data4 == (uchar  [8])local_40->m_manifest_item) &&
         (bVar1 = ON_Hash32Table::RemoveItem
                            (&this->super_ON_Hash32Table,&local_40->super_ON_Hash32TableItem), bVar1
         )) {
        ON_ManifestHash32TableItemFixedSizePool::ReturnHashTableItem(this->m_fsp,local_40);
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool RemoveManifestItem(
    const class ON_ComponentManifestItem_PRIVATE* manifest_item
    )
  {
    const ON_UUID id = IdFromManifestItem(manifest_item);
    if ( ON_nil_uuid == id )
      return false;
    const ON__UINT32 hash32 = ON_ComponentIdHash32Table::IdHash32(id);

    for (const ON_Hash32TableItem* hash_table_item = FirstItemWithHash(hash32); nullptr != hash_table_item; hash_table_item = NextItemWithHash(hash_table_item))
    {
      if (manifest_item == ((const ON_ComponentManifestHash32TableItem*)hash_table_item)->m_manifest_item)
      {
        if (RemoveItem(const_cast<ON_Hash32TableItem*>(hash_table_item)))
        {
          m_fsp.ReturnHashTableItem((ON_ComponentManifestHash32TableItem*)hash_table_item);
          return true;
        }
      }
    }

    return false;
  }